

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O0

void __thiscall CCharacterCore::Reset(CCharacterCore *this)

{
  long in_RDI;
  long in_FS_OFFSET;
  vector2_base<float> local_30;
  vector2_base<float> local_28;
  vector2_base<float> local_20;
  vector2_base<float> local_18;
  vector2_base<float> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  vector2_base<float>::vector2_base(&local_10,0.0,0.0);
  *(vector2_base<float> *)(in_RDI + 0x10) = local_10;
  vector2_base<float>::vector2_base(&local_18,0.0,0.0);
  *(vector2_base<float> *)(in_RDI + 0x18) = local_18;
  vector2_base<float>::vector2_base(&local_20,0.0,0.0);
  *(vector2_base<float> *)(in_RDI + 0x20) = local_20;
  vector2_base<float>::vector2_base(&local_28,0.0,0.0);
  *(vector2_base<float> *)(in_RDI + 0x28) = local_28;
  vector2_base<float>::vector2_base(&local_30,0.0,0.0);
  *(vector2_base<float> *)(in_RDI + 0x30) = local_30;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  *(undefined4 *)(in_RDI + 0x40) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  *(undefined1 *)(in_RDI + 0x50) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCharacterCore::Reset()
{
	m_Pos = vec2(0,0);
	m_Vel = vec2(0,0);
	m_HookDragVel = vec2(0,0);
	m_HookPos = vec2(0,0);
	m_HookDir = vec2(0,0);
	m_HookTick = 0;
	m_HookState = HOOK_IDLE;
	m_HookedPlayer = -1;
	m_Jumped = 0;
	m_TriggeredEvents = 0;
	m_Death = false;
}